

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_json.cpp
# Opt level: O0

int __thiscall
cppcms::rpc::json_rpc_server::bind(json_rpc_server *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  int extraout_EAX;
  mapped_type *this_00;
  method_data data;
  method_data *in_stack_ffffffffffffff88;
  function<void_(const_std::vector<cppcms::json::value,_std::allocator<cppcms::json::value>_>_&)>
  *in_stack_ffffffffffffffa8;
  function<void_(const_std::vector<cppcms::json::value,_std::allocator<cppcms::json::value>_>_&)>
  *in_stack_ffffffffffffffb0;
  key_type *in_stack_ffffffffffffffc8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::rpc::json_rpc_server::method_data,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::rpc::json_rpc_server::method_data>_>_>
  *in_stack_ffffffffffffffd0;
  
  method_data::method_data((method_data *)0x44cf40);
  std::
  function<void_(const_std::vector<cppcms::json::value,_std::allocator<cppcms::json::value>_>_&)>::
  operator=(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::rpc::json_rpc_server::method_data,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::rpc::json_rpc_server::method_data>_>_>
            ::operator[](in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  method_data::operator=(this_00,in_stack_ffffffffffffff88);
  method_data::~method_data((method_data *)0x44cf8e);
  return extraout_EAX;
}

Assistant:

void json_rpc_server::bind(std::string const &name,method_type const &method,role_type role)
	{
		method_data data;
		data.method=method;
		data.role=role;
		methods_[name]=data;
	}